

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O2

void __thiscall
simplex_tree_from_file<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::test_method
          (simplex_tree_from_file<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *this)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  Filtration_value *pFVar5;
  Siblings *pSVar6;
  uint uVar7;
  pointer pvVar8;
  uint uVar9;
  uint uVar10;
  char *local_430;
  char *local_428;
  undefined1 local_420 [8];
  undefined8 local_418;
  shared_count sStack_410;
  Siblings local_408;
  pointer local_3e0;
  Simplex_handle local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  string inputFile;
  Simplex_tree<Gudhi::Simplex_tree_options_default> st;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  ifstream simplex_tree_stream;
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::clog,"TEST OF SIMPLEX TREE FROM A FILE");
  std::endl<char,std::char_traits<char>>(poVar3);
  st.nodes_label_to_list_._M_h._M_buckets = &st.nodes_label_to_list_._M_h._M_single_bucket;
  st.nodes_label_to_list_._M_h._M_bucket_count = 1;
  st.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  st.nodes_label_to_list_._M_h._M_element_count = 0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  st.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  st.null_vertex_ = -1;
  st.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  st.root_.parent_ = -1;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  st.dimension_ = -1;
  st.dimension_to_be_lowered_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputFile,"simplex_tree_for_unit_test.txt",
             (allocator<char> *)&simplex_tree_stream);
  std::ifstream::ifstream(&simplex_tree_stream,inputFile._M_dataplus._M_p,_S_in);
  Gudhi::operator>>((istream *)&simplex_tree_stream,&st);
  poVar3 = std::operator<<((ostream *)&std::clog,"The complex contains ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," simplices");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar2 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x79);
  sVar4 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  local_420[0] = sVar4 == 0x22ff9;
  local_418 = 0;
  sStack_410.pi_ = (sp_counted_base *)0x0;
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = (stored_size_type)&local_430;
  local_430 = "st.num_simplices() == 143353";
  local_428 = "";
  local_408.parent_ = local_408.parent_ & 0xffffff00;
  local_408.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)&PTR__lazy_ostream_001c1f38;
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_start =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_260 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_410);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x7a);
  iVar2 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  local_420[0] = iVar2 == 3;
  local_418 = 0;
  sStack_410.pi_ = (sp_counted_base *)0x0;
  local_430 = "st.dimension() == 3";
  local_428 = "";
  local_408.parent_ = local_408.parent_ & 0xffffff00;
  local_408.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)&PTR__lazy_ostream_001c1f38;
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_start =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = (stored_size_type)&local_430;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_290 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_410);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a8,0x7b);
  local_420[0] = st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size != 0;
  local_418 = 0;
  sStack_410.pi_ = (sp_counted_base *)0x0;
  local_430 = "!st.is_empty()";
  local_428 = "";
  local_408.parent_ = local_408.parent_ & 0xffffff00;
  local_408.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)&PTR__lazy_ostream_001c1f38;
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_start =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = (stored_size_type)&local_430;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2c0 = "";
  boost::test_tools::tt_detail::report_assertion(local_420,&local_408,&local_2c8,0x7b,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_410);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::maybe_initialize_filtration(&st);
  local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity =
       (stored_size_type)
       st.filtration_vect_.
       super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = st.filtration_vect_.
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 0;
  while (pvVar8 != (pointer)local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity) {
    ppVar1 = pvVar8->m_ptr;
    local_3d8.m_ptr = ppVar1;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_408,&st,&local_3d8);
    uVar10 = 0;
    pSVar6 = &local_408;
    uVar7 = local_408.parent_;
    while ((pSVar6 = (((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
                        *)&pSVar6->oncles_)->m_Begin).sib_,
           pSVar6 != (Siblings *)local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_start ||
           (uVar7 != (uint)local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_size))) {
      uVar10 = uVar10 + 1;
      uVar7 = pSVar6->parent_;
    }
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_378 = "";
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x86,&local_390);
    pFVar5 = (Filtration_value *)&ppVar1->second;
    if (ppVar1 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)0x0) {
      pFVar5 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
                Filtration_simplex_base_real::inf_;
    }
    local_420[0] = ABS((float)(int)uVar10 * -0.1 +
                       (float)(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                                 *)pFVar5)->super_Filtration_simplex_base).filt_) < 1.1920929e-07;
    local_418 = 0;
    sStack_410.pi_ = (sp_counted_base *)0x0;
    local_430 = "AreAlmostTheSame(st.filtration(f_simplex), (0.1 * size))";
    local_428 = "";
    local_408.parent_ = local_408.parent_ & 0xffffff00;
    local_408.oncles_ =
         (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
          *)&PTR__lazy_ostream_001c1f38;
    local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_start =
         (pointer)&boost::unit_test::lazy_ostream::inst;
    local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = (stored_size_type)&local_430;
    local_3a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_398 = "";
    boost::test_tools::tt_detail::report_assertion(local_420,&local_408,&local_3a0,0x86,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_410);
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_3a8 = "";
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x87,&local_3c0);
    local_420[0] = uVar9 <= uVar10;
    local_418 = 0;
    sStack_410.pi_ = (sp_counted_base *)0x0;
    local_430 = "previous_size <= size";
    local_428 = "";
    local_408.parent_ = local_408.parent_ & 0xffffff00;
    local_408.oncles_ =
         (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
          *)&PTR__lazy_ostream_001c1f38;
    local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_start =
         (pointer)&boost::unit_test::lazy_ostream::inst;
    local_408.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = (stored_size_type)&local_430;
    local_3d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
    ;
    local_3c8 = "";
    boost::test_tools::tt_detail::report_assertion(local_420,&local_408,&local_3d0,0x87,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_410);
    uVar9 = uVar10;
    pvVar8 = local_3e0 + 1;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&simplex_tree_stream);
  std::__cxx11::string::~string((string *)&inputFile);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree(&st);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_from_file, typeST, list_of_tested_variants) {
  // TEST OF INSERTION
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF SIMPLEX TREE FROM A FILE" << std::endl;
  typeST st;

  std::string inputFile("simplex_tree_for_unit_test.txt");
  std::ifstream simplex_tree_stream(inputFile.c_str());
  simplex_tree_stream >> st;

  // Display the Simplex_tree
  std::clog << "The complex contains " << st.num_simplices() << " simplices" << std::endl;
  std::clog << "   - dimension " << st.dimension() << std::endl;

  // Check
  BOOST_CHECK(st.num_simplices() == 143353);
  BOOST_CHECK(st.dimension() == 3);
  BOOST_CHECK(!st.is_empty());

  int previous_size = 0;
  for (auto f_simplex : st.filtration_simplex_range()) {
    // Size of simplex
    int size = 0;
    for (auto vertex : st.simplex_vertex_range(f_simplex)) {
      // Remove warning
      (void) vertex;
      size++;
    }
    BOOST_CHECK(AreAlmostTheSame(st.filtration(f_simplex), (0.1 * size))); // Specific test: filtration = 0.1 * simplex_size
    BOOST_CHECK(previous_size <= size); // Check list is sorted (because of sorted filtrations in simplex_tree.txt)
    previous_size = size;
  }
  simplex_tree_stream.close();
}